

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSwapBuffersWithDamageTests.cpp
# Opt level: O2

string * __thiscall
deqp::egl::(anonymous_namespace)::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<deqp::egl::(anonymous_namespace)::DrawType,_std::allocator<deqp::egl::(anonymous_namespace)::DrawType>_>
          *frameDrawType)

{
  int iVar1;
  char *pcVar2;
  size_t ndx;
  ulong uVar3;
  ostringstream stream;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar3 = 0;
  do {
    if ((ulong)(*(long *)(this + 8) - *(long *)this >> 2) <= uVar3) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      return __return_storage_ptr__;
    }
    iVar1 = *(int *)(*(long *)this + uVar3 * 4);
    pcVar2 = "clear";
    if (iVar1 == 0) {
LAB_00dda6bd:
      std::operator<<((ostream *)local_1a8,pcVar2);
    }
    else if (iVar1 == 1) {
      pcVar2 = "render";
      goto LAB_00dda6bd;
    }
    if (uVar3 < (*(long *)(this + 8) - *(long *)this >> 2) - 1U) {
      std::operator<<((ostream *)local_1a8,"_");
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

string generateTestName (const vector<DrawType>& frameDrawType)
{
	std::ostringstream stream;

	for (size_t ndx = 0; ndx < frameDrawType.size(); ndx++)
	{
		if (frameDrawType[ndx] == DRAWTYPE_GLES2_RENDER)
			stream << "render";
		else if (frameDrawType[ndx] == DRAWTYPE_GLES2_CLEAR)
			stream << "clear";
		else
			DE_ASSERT(false);

		if (ndx < frameDrawType.size()-1)
			stream << "_";
	}

	return stream.str();
}